

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void FBehavior::StaticLoadDefaultModules(void)

{
  bool bVar1;
  int iVar2;
  int lastlump;
  FScanner sc;
  
  lastlump = 0;
  while( true ) {
    iVar2 = FWadCollection::FindLump(&Wads,"LOADACS",&lastlump,false);
    if (iVar2 == -1) break;
    FScanner::FScanner(&sc,iVar2);
    while( true ) {
      bVar1 = FScanner::GetString(&sc);
      if (!bVar1) break;
      iVar2 = FWadCollection::CheckNumForName(&Wads,sc.String,4);
      if (iVar2 < 0) {
        Printf("\x1cGCould not find autoloaded ACS library %s\n",sc.String);
      }
      else {
        StaticLoadModule(iVar2,(FileReader *)0x0,0);
      }
    }
    FScanner::~FScanner(&sc);
  }
  return;
}

Assistant:

void FBehavior::StaticLoadDefaultModules ()
{
	// Scan each LOADACS lump and load the specified modules in order
	int lump, lastlump = 0;

	while ((lump = Wads.FindLump ("LOADACS", &lastlump)) != -1)
	{
		FScanner sc(lump);
		while (sc.GetString())
		{
			int acslump = Wads.CheckNumForName (sc.String, ns_acslibrary);
			if (acslump >= 0)
			{
				StaticLoadModule (acslump);
			}
			else
			{
				Printf (TEXTCOLOR_RED "Could not find autoloaded ACS library %s\n", sc.String);
			}
		}
	}
}